

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

CURLcode cookie_output(Curl_easy *data,CookieInfo *ci,char *filename)

{
  int iVar1;
  void *__base;
  void *pvVar2;
  char *pcVar3;
  char *format_ptr;
  Cookie *co;
  Curl_llist_node *n;
  Cookie **array;
  size_t nvalid;
  uint i;
  CURLcode error;
  char *tempstore;
  FILE *pFStack_30;
  _Bool use_stdout;
  FILE *out;
  char *filename_local;
  CookieInfo *ci_local;
  Curl_easy *data_local;
  
  pFStack_30 = (FILE *)0x0;
  tempstore._7_1_ = 0;
  _i = (char *)0x0;
  if (ci == (CookieInfo *)0x0) {
    return CURLE_OK;
  }
  out = (FILE *)filename;
  filename_local = (char *)ci;
  ci_local = (CookieInfo *)data;
  remove_expired(ci);
  iVar1 = strcmp("-",(char *)out);
  if (iVar1 == 0) {
    pFStack_30 = _stdout;
    tempstore._7_1_ = 1;
LAB_00129dd9:
    fputs("# Netscape HTTP Cookie File\n# https://curl.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
          ,pFStack_30);
    if (*(int *)(filename_local + 0x7e8) != 0) {
      array = (Cookie **)0x0;
      __base = (*Curl_ccalloc)(1,(long)*(int *)(filename_local + 0x7e8) << 3);
      if (__base == (void *)0x0) {
        nvalid._4_4_ = CURLE_OUT_OF_MEMORY;
        goto LAB_00129fb3;
      }
      for (nvalid._0_4_ = 0; (uint)nvalid < 0x3f; nvalid._0_4_ = (uint)nvalid + 1) {
        for (co = (Cookie *)
                  Curl_llist_head((Curl_llist *)(filename_local + (ulong)(uint)nvalid * 0x20));
            co != (Cookie *)0x0; co = (Cookie *)Curl_node_next(&co->node)) {
          pvVar2 = Curl_node_elem(&co->node);
          if (*(long *)((long)pvVar2 + 0x60) != 0) {
            *(void **)((long)__base + (long)array * 8) = pvVar2;
            array = (Cookie **)((long)array + 1);
          }
        }
      }
      qsort(__base,(size_t)array,8,cookie_sort_ct);
      for (nvalid._0_4_ = 0; (Cookie **)(ulong)(uint)nvalid < array; nvalid._0_4_ = (uint)nvalid + 1
          ) {
        pcVar3 = get_netscape_format(*(Cookie **)((long)__base + (ulong)(uint)nvalid * 8));
        if (pcVar3 == (char *)0x0) {
          (*Curl_cfree)(__base);
          nvalid._4_4_ = CURLE_OUT_OF_MEMORY;
          goto LAB_00129fb3;
        }
        curl_mfprintf((FILE *)pFStack_30,"%s\n",pcVar3);
        (*Curl_cfree)(pcVar3);
      }
      (*Curl_cfree)(__base);
    }
    if ((tempstore._7_1_ & 1) == 0) {
      fclose(pFStack_30);
      pFStack_30 = (FILE *)0x0;
      if ((_i != (char *)0x0) && (iVar1 = Curl_rename(_i,(char *)out), iVar1 != 0)) {
        unlink(_i);
        nvalid._4_4_ = CURLE_WRITE_ERROR;
        goto LAB_00129fb3;
      }
    }
    (*Curl_cfree)(_i);
    data_local._4_4_ = CURLE_OK;
  }
  else {
    nvalid._4_4_ = Curl_fopen((Curl_easy *)ci_local,(char *)out,(FILE **)&stack0xffffffffffffffd0,
                              (char **)&i);
    if (nvalid._4_4_ == CURLE_OK) goto LAB_00129dd9;
LAB_00129fb3:
    if ((pFStack_30 != (FILE *)0x0) && ((tempstore._7_1_ & 1) == 0)) {
      fclose(pFStack_30);
    }
    (*Curl_cfree)(_i);
    data_local._4_4_ = nvalid._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode cookie_output(struct Curl_easy *data,
                              struct CookieInfo *ci,
                              const char *filename)
{
  FILE *out = NULL;
  bool use_stdout = FALSE;
  char *tempstore = NULL;
  CURLcode error = CURLE_OK;

  if(!ci)
    /* no cookie engine alive */
    return CURLE_OK;

  /* at first, remove expired cookies */
  remove_expired(ci);

  if(!strcmp("-", filename)) {
    /* use stdout */
    out = stdout;
    use_stdout = TRUE;
  }
  else {
    error = Curl_fopen(data, filename, &out, &tempstore);
    if(error)
      goto error;
  }

  fputs("# Netscape HTTP Cookie File\n"
        "# https://curl.se/docs/http-cookies.html\n"
        "# This file was generated by libcurl! Edit at your own risk.\n\n",
        out);

  if(ci->numcookies) {
    unsigned int i;
    size_t nvalid = 0;
    struct Cookie **array;
    struct Curl_llist_node *n;

    array = calloc(1, sizeof(struct Cookie *) * ci->numcookies);
    if(!array) {
      error = CURLE_OUT_OF_MEMORY;
      goto error;
    }

    /* only sort the cookies with a domain property */
    for(i = 0; i < COOKIE_HASH_SIZE; i++) {
      for(n = Curl_llist_head(&ci->cookielist[i]); n;
          n = Curl_node_next(n)) {
        struct Cookie *co = Curl_node_elem(n);
        if(!co->domain)
          continue;
        array[nvalid++] = co;
      }
    }

    qsort(array, nvalid, sizeof(struct Cookie *), cookie_sort_ct);

    for(i = 0; i < nvalid; i++) {
      char *format_ptr = get_netscape_format(array[i]);
      if(!format_ptr) {
        free(array);
        error = CURLE_OUT_OF_MEMORY;
        goto error;
      }
      fprintf(out, "%s\n", format_ptr);
      free(format_ptr);
    }

    free(array);
  }

  if(!use_stdout) {
    fclose(out);
    out = NULL;
    if(tempstore && Curl_rename(tempstore, filename)) {
      unlink(tempstore);
      error = CURLE_WRITE_ERROR;
      goto error;
    }
  }

  /*
   * If we reach here we have successfully written a cookie file so there is
   * no need to inspect the error, any error case should have jumped into the
   * error block below.
   */
  free(tempstore);
  return CURLE_OK;

error:
  if(out && !use_stdout)
    fclose(out);
  free(tempstore);
  return error;
}